

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

BinaryenLiteral * toBinaryenLiteral(BinaryenLiteral *__return_storage_ptr__,Literal x)

{
  ulong uVar1;
  char *pcVar2;
  bool bVar3;
  uint uVar4;
  HeapTypeKind HVar5;
  Literal *in_RSI;
  Name NVar6;
  HeapType local_28;
  HeapType heapType;
  
  uVar1 = (in_RSI->type).id;
  __return_storage_ptr__->type = uVar1;
  if ((uVar1 < 2) || ((uVar1 & 1) != 0 && 6 < uVar1)) {
    __assert_fail("x.type.isSingle()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0x37,"BinaryenLiteral toBinaryenLiteral(Literal)");
  }
  if (6 < uVar1) {
switchD_00cffcae_default:
    if ((uVar1 < 7) || ((uVar1 & 1) != 0)) {
      __assert_fail("x.type.isRef()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                    ,0x4e,"BinaryenLiteral toBinaryenLiteral(Literal)");
    }
    local_28 = wasm::Type::getHeapType(&in_RSI->type);
    if (local_28.id < 0x7d) {
      uVar4 = (uint)local_28.id & 0x7b;
      uVar4 = uVar4 << 0x1d | uVar4 - 8 >> 3;
      if (uVar4 - 10 < 5) {
        return __return_storage_ptr__;
      }
      switch(uVar4) {
      case 0:
        wasm::handle_unreachable
                  ("TODO: extern literals",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                   ,0x55);
      case 1:
      case 2:
      case 3:
      case 4:
      case 6:
      case 7:
      case 8:
        wasm::handle_unreachable
                  ("invalid type",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                   ,0x5d);
      case 5:
        wasm::handle_unreachable
                  ("TODO: i31",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                   ,0x53);
      case 9:
        wasm::handle_unreachable
                  ("TODO: string literals",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                   ,0x5f);
      }
    }
    HVar5 = wasm::HeapType::getKind(&local_28);
    if (HVar5 == Func) {
      NVar6 = wasm::Literal::getFunc(in_RSI);
      (__return_storage_ptr__->field_1).i64 = (int64_t)NVar6.super_IString.str._M_str;
      return __return_storage_ptr__;
    }
    bVar3 = wasm::Type::isData(&in_RSI->type);
    if (bVar3) {
      wasm::handle_unreachable
                ("TODO: gc data",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                 ,0x6e);
    }
    __assert_fail("x.isData()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0x6d,"BinaryenLiteral toBinaryenLiteral(Literal)");
  }
  switch(uVar1 & 0xffffffff) {
  case 0:
  case 1:
    wasm::handle_unreachable
              ("unexpected type",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
               ,0x4b);
  case 2:
    if (uVar1 != 2) {
      __assert_fail("type == Type::i32",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                    ,0x120,"int32_t wasm::Literal::geti32() const");
    }
    break;
  case 3:
    if (uVar1 != 3) {
      __assert_fail("type == Type::i64",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                    ,0x129,"int64_t wasm::Literal::geti64() const");
    }
    goto LAB_00cffd95;
  case 4:
    if (uVar1 != 4) {
      __assert_fail("type == Type::f32",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                    ,0x14b,"int32_t wasm::Literal::reinterpreti32() const");
    }
    break;
  case 5:
    if (uVar1 != 5) {
      __assert_fail("type == Type::f64",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                    ,0x14f,"int64_t wasm::Literal::reinterpreti64() const");
    }
LAB_00cffd95:
    (__return_storage_ptr__->field_1).i64 = (in_RSI->field_0).i64;
    return __return_storage_ptr__;
  case 6:
    if (uVar1 == 6) {
      pcVar2 = (in_RSI->field_0).func.super_IString.str._M_str;
      (__return_storage_ptr__->field_1).i64 = (in_RSI->field_0).i64;
      *(char **)((long)&__return_storage_ptr__->field_1 + 8) = pcVar2;
      return __return_storage_ptr__;
    }
    __assert_fail("type == Type::v128",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                  ,0x142,"uint8_t *wasm::Literal::getv128Ptr()");
  default:
    goto switchD_00cffcae_default;
  }
  (__return_storage_ptr__->field_1).i32 = (in_RSI->field_0).i32;
  return __return_storage_ptr__;
}

Assistant:

BinaryenLiteral toBinaryenLiteral(Literal x) {
  BinaryenLiteral ret;
  ret.type = x.type.getID();
  assert(x.type.isSingle());
  if (x.type.isBasic()) {
    switch (x.type.getBasic()) {
      case Type::i32:
        ret.i32 = x.geti32();
        return ret;
      case Type::i64:
        ret.i64 = x.geti64();
        return ret;
      case Type::f32:
        ret.i32 = x.reinterpreti32();
        return ret;
      case Type::f64:
        ret.i64 = x.reinterpreti64();
        return ret;
      case Type::v128:
        memcpy(&ret.v128, x.getv128Ptr(), 16);
        return ret;
      case Type::none:
      case Type::unreachable:
        WASM_UNREACHABLE("unexpected type");
    }
  }
  assert(x.type.isRef());
  auto heapType = x.type.getHeapType();
  if (heapType.isBasic()) {
    switch (heapType.getBasic(Unshared)) {
      case HeapType::i31:
        WASM_UNREACHABLE("TODO: i31");
      case HeapType::ext:
        WASM_UNREACHABLE("TODO: extern literals");
      case HeapType::any:
      case HeapType::eq:
      case HeapType::func:
      case HeapType::cont:
      case HeapType::struct_:
      case HeapType::array:
      case HeapType::exn:
        WASM_UNREACHABLE("invalid type");
      case HeapType::string:
        WASM_UNREACHABLE("TODO: string literals");
      case HeapType::none:
      case HeapType::noext:
      case HeapType::nofunc:
      case HeapType::nocont:
      case HeapType::noexn:
        // Null.
        return ret;
    }
  }
  if (heapType.isSignature()) {
    ret.func = x.getFunc().str.data();
    return ret;
  }
  assert(x.isData());
  WASM_UNREACHABLE("TODO: gc data");
}